

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O2

void leccalc::loadoccurrence
               (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *event_to_periods,int *totalperiods)

{
  FILE *__stream;
  int date_opts;
  occurrence occ;
  
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream != (FILE *)0x0) {
    date_opts = 0;
    fread(&date_opts,4,1,__stream);
    fread(totalperiods,4,1,__stream);
    if ((uint)date_opts < 2) {
      loadoccurrence<occurrence>(event_to_periods,&occ,(FILE *)__stream);
    }
    else {
      loadoccurrence<occurrence_granular>
                (event_to_periods,(occurrence_granular *)&occ,(FILE *)__stream);
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"FATAL: Error reading file %s\n","input/occurrence.bin");
  exit(-1);
}

Assistant:

void loadoccurrence(std::map<int, std::vector<int> >& event_to_periods,
			    int& totalperiods)
	{
		FILE* fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: Error reading file %s\n",
				OCCURRENCE_FILE);
			exit(-1);
		}

		int date_opts = 0;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		fread(&totalperiods, sizeof(totalperiods), 1, fin);
		int granular_date = date_opts >> 1;
		if (granular_date) {
			occurrence_granular occ;
			loadoccurrence(event_to_periods, occ, fin);
		} else {
			occurrence occ;
			loadoccurrence(event_to_periods, occ, fin);
		}

		fclose(fin);
	}